

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O2

bool __thiscall Js::AsmJsModuleCompiler::CommitModule(AsmJsModuleCompiler *this)

{
  undefined1 *puVar1;
  char cVar2;
  RegSlot RVar3;
  RegSlot RVar4;
  Type TVar5;
  FuncInfo *this_00;
  ByteCodeGenerator *this_01;
  uint *puVar6;
  code *pcVar7;
  int i;
  int i_00;
  Type TVar8;
  Type TVar9;
  Type TVar10;
  Type TVar11;
  Type TVar12;
  Type TVar13;
  Type TVar14;
  AsmJsModuleCompiler *pAVar15;
  bool bVar16;
  Which WVar17;
  type_info tVar18;
  RegSlot RVar19;
  int iVar20;
  FunctionBody *this_02;
  AsmJsModuleInfo *pAVar21;
  undefined4 *puVar22;
  IdentPtr pid;
  AsmJsSymbol *pAVar23;
  EntryType *pEVar24;
  AsmJsSymbol **ppAVar25;
  Recycler *alloc;
  AsmJsVar *pAVar26;
  ModuleVar *pMVar27;
  AsmJsModuleArg *pAVar28;
  AsmJsImportFunction *pAVar29;
  ModuleFunctionImport *pMVar30;
  AsmJsFunctionTable *this_03;
  ModuleFunctionTable *pMVar31;
  AsmJsConstantImport *pAVar32;
  ModuleVarImport *pMVar33;
  AsmJsMathConst *pAVar34;
  AsmJsFunc *pAVar35;
  ModuleFunction *pMVar36;
  AsmJsMathFunction *pAVar37;
  ParseNodeVar *this_04;
  uint j;
  int iVar38;
  uint uVar39;
  ulong uVar40;
  BaseDictionary<int,_Js::AsmJsSymbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_05;
  undefined1 local_d0 [8];
  EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  exportIter;
  undefined **local_90;
  AsmJsSlot *slot;
  size_t local_80;
  char *local_78;
  DWORD local_70;
  Type local_64;
  FuncInfo *local_60;
  BaseDictionary<int,_Js::AsmJsSymbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *local_58;
  int local_4c;
  AsmJsModuleCompiler *local_48;
  AsmJsModuleInfo *local_40;
  PropertyId local_38;
  uint local_34;
  
  this_00 = this->mModuleFunctionNode->funcInfo;
  this_02 = FuncInfo::GetParsedFunctionBody(this_00);
  pAVar21 = FunctionBody::AllocateAsmJsModuleInfo(this_02);
  local_60 = this_00;
  local_48 = this;
  if (((this_00->byteCodeFunction->super_FunctionProxy).field_0x45 & 0x20) != 0) {
    this_04 = this->mModuleFunctionNode->pnodeName;
    if (this_04 == (ParseNodeVar *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar22 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar22 = 1;
      bVar16 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                   ,0x7e,"(GetModuleFunctionNode()->pnodeName)",
                                   "GetModuleFunctionNode()->pnodeName");
      if (!bVar16) goto LAB_00871156;
      *puVar22 = 0;
      this_04 = local_48->mModuleFunctionNode->pnodeName;
    }
    if ((this_04->super_ParseNode).nop != knopVarDecl) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar22 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar22 = 1;
      bVar16 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                   ,0x7f,"(GetModuleFunctionNode()->pnodeName->nop == knopVarDecl)",
                                   "GetModuleFunctionNode()->pnodeName->nop == knopVarDecl");
      if (!bVar16) {
LAB_00871156:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar22 = 0;
      this_04 = local_48->mModuleFunctionNode->pnodeName;
    }
    this = local_48;
    bVar16 = Symbol::IsInSlot(this_04->sym,local_48->mCx->byteCodeGenerator,this_00,false);
    if (bVar16) {
      this_01 = this->mCx->byteCodeGenerator;
      pid = ParseNode::name(&this_04->super_ParseNode);
      ByteCodeGenerator::AssignPropertyId(this_01,pid);
      pAVar23 = (AsmJsSymbol *)new<Memory::ArenaAllocator>(0x38,&this->mAllocator,0x35916e);
      AsmJsClosureFunction::AsmJsClosureFunction
                ((AsmJsClosureFunction *)pAVar23,this_04->pid,ClosureFunction,&this->mAllocator);
      DefineIdentifier(this,this_04->pid,pAVar23);
    }
  }
  pAVar15 = local_48;
  if (this->mBufferArgName == (PropertyName)0x0) {
    if (this->mForeignArgName == (PropertyName)0x0) {
      local_34 = (uint)(this->mStdLibArgName != (PropertyName)0x0);
    }
    else {
      local_34 = 2;
    }
  }
  else {
    local_34 = 3;
  }
  iVar38 = (local_48->mFunctionTableArray).
           super_ReadOnlyList<Js::AsmJsFunctionTable_*,_Memory::ArenaAllocator,_DefaultComparer>.
           count;
  RVar3 = (local_48->mImportFunctions).mRegisterCount;
  RVar4 = (local_48->mImportFunctions).mNbConst;
  local_40 = pAVar21;
  AsmJsModuleInfo::SetFunctionCount
            (pAVar21,(local_48->mFunctionArray).
                     super_ReadOnlyList<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_DefaultComparer>.
                     count);
  AsmJsModuleInfo::SetFunctionTableCount(pAVar21,iVar38);
  AsmJsModuleInfo::SetFunctionImportCount(pAVar21,RVar3 - RVar4);
  AsmJsModuleInfo::SetVarCount(pAVar21,pAVar15->mVarCount);
  AsmJsModuleInfo::SetVarImportCount(pAVar21,pAVar15->mVarImportCount);
  pAVar21->mArgInCount = local_34;
  TVar8 = (pAVar15->mModuleMemory).mStdLibOffset;
  TVar9 = (pAVar15->mModuleMemory).mDoubleOffset;
  TVar10 = (pAVar15->mModuleMemory).mFuncOffset;
  TVar11 = (pAVar15->mModuleMemory).mFFIOffset;
  TVar12 = (pAVar15->mModuleMemory).mFuncPtrOffset;
  TVar13 = (pAVar15->mModuleMemory).mIntOffset;
  TVar14 = (pAVar15->mModuleMemory).mFloatOffset;
  (pAVar21->mModuleMemory).mArrayBufferOffset = (pAVar15->mModuleMemory).mArrayBufferOffset;
  (pAVar21->mModuleMemory).mStdLibOffset = TVar8;
  (pAVar21->mModuleMemory).mDoubleOffset = TVar9;
  (pAVar21->mModuleMemory).mFuncOffset = TVar10;
  (pAVar21->mModuleMemory).mFFIOffset = TVar11;
  (pAVar21->mModuleMemory).mFuncPtrOffset = TVar12;
  (pAVar21->mModuleMemory).mIntOffset = TVar13;
  (pAVar21->mModuleMemory).mFloatOffset = TVar14;
  (pAVar21->mModuleMemory).mMemorySize = (pAVar15->mModuleMemory).mMemorySize;
  (pAVar21->mAsmMathBuiltinUsed).data[0].word = (pAVar15->mAsmMathBuiltinUsedBV).data[0].word;
  (pAVar21->mAsmArrayBuiltinUsed).data[0].word = (pAVar15->mAsmArrayBuiltinUsedBV).data[0].word;
  pAVar21->mMaxHeapAccess = pAVar15->mMaxHeapAccess;
  ParseableFunctionInfo::SetInParamsCount(&this_02->super_ParseableFunctionInfo,4);
  ParseableFunctionInfo::SetReportedInParamsCount(&this_02->super_ParseableFunctionInfo,4);
  FunctionBody::CheckAndSetConstantCount(this_02,2);
  FunctionBody::CreateConstantTable(this_02);
  FunctionBody::CheckAndSetVarCount(this_02,3);
  puVar1 = &(this_02->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46;
  *puVar1 = *puVar1 | 2;
  puVar1 = &(this_02->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
  *puVar1 = *puVar1 | 0x40;
  FunctionBody::NewObjectLiteral(this_02);
  AsmJSByteCodeGenerator::EmitEmptyByteCode
            (local_60,pAVar15->mCx->byteCodeGenerator,&pAVar15->mModuleFunctionNode->super_ParseNode
            );
  pAVar21->mExportFunctionIndex = pAVar15->mExportFuncIndex;
  AsmJsModuleInfo::SetExportsCount
            (pAVar21,(pAVar15->mExports).count - (pAVar15->mExports).freeCount);
  JsUtil::
  BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)local_d0,&pAVar15->mExports);
  iVar38 = 0;
  while (bVar16 = JsUtil::
                  BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::
                  EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                  ::IsValid((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                             *)local_d0), bVar16) {
    pEVar24 = JsUtil::
              BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::
              IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
              ::Current((IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                         *)local_d0);
    puVar6 = (pAVar21->mExportsFunctionLocation).ptr;
    (&(pAVar21->mExports).ptr[1].count)[iVar38] =
         (pEVar24->
         super_DefaultHashedEntry<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_JsUtil::(anonymous_namespace)::KeyValueEntry>
         ).super_KeyValueEntry<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport>.
         super_ValueEntry<Js::AsmJsModuleCompiler::AsmJsModuleExport,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport>_>
         .super_KeyValueEntryDataLayout2<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport>.value.id;
    puVar6[iVar38] =
         (pEVar24->
         super_DefaultHashedEntry<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_JsUtil::(anonymous_namespace)::KeyValueEntry>
         ).super_KeyValueEntry<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport>.
         super_ValueEntry<Js::AsmJsModuleCompiler::AsmJsModuleExport,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport>_>
         .super_KeyValueEntryDataLayout2<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport>.value.
         location;
    JsUtil::
    BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::MoveNext((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                *)local_d0);
    iVar38 = iVar38 + 1;
  }
  this_05 = &local_48->mModuleEnvironment;
  uVar39 = (local_48->mModuleEnvironment).count - (local_48->mModuleEnvironment).freeCount;
  AsmJsModuleInfo::InitializeSlotMap(pAVar21,uVar39);
  local_60 = (FuncInfo *)(pAVar21->mSlotMap).ptr;
  puVar22 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  iVar38 = 0;
  if ((int)uVar39 < 1) {
    uVar39 = 0;
  }
  i = 0;
  exportIter.
  super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
  .usedEntryCount = 0;
  exportIter.
  super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
  ._28_4_ = 0;
  i_00 = 0;
  local_4c = 0;
  local_58 = this_05;
  local_34 = uVar39;
  do {
    if (iVar38 == uVar39) {
      return true;
    }
    ppAVar25 = JsUtil::
               BaseDictionary<int,_Js::AsmJsSymbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetValueAt(this_05,iVar38);
    pAVar23 = *ppAVar25;
    if (pAVar23 == (AsmJsSymbol *)0x0) goto switchD_00870e15_caseD_b;
    local_90 = &AsmJsSlot::typeinfo;
    slot = (AsmJsSlot *)0x0;
    local_80 = 0xffffffffffffffff;
    local_78 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
    ;
    local_70 = 200;
    alloc = Memory::Recycler::TrackAllocInfo
                      (local_48->mCx->scriptContext->recycler,
                       (TrackAllocData *)&stack0xffffffffffffff70);
    local_90 = (undefined **)new<Memory::Recycler>(0x18,alloc,0x6db486);
    *(undefined8 *)((long)local_90 + 0x10) = 0;
    *local_90 = (undefined *)0x0;
    *(undefined8 *)((long)local_90 + 8) = 0;
    *(SymbolType *)((long)local_90 + 4) = pAVar23->mType;
    local_38 = pAVar23->mName->m_propertyId;
    JsUtil::
    BaseDictionary<int,Js::AsmJsSlot*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<int,Js::AsmJsSlot*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
              ((BaseDictionary<int,Js::AsmJsSlot*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)local_60,&local_38,(AsmJsSlot **)&stack0xffffffffffffff70);
    switch(pAVar23->mType) {
    case Variable:
      pAVar26 = AsmJsVar::FromSymbol(pAVar23);
      pMVar27 = AsmJsModuleInfo::GetVar(local_40,local_4c);
      pMVar27->location = (pAVar26->super_AsmJsVarBase).mLocation;
      local_38 = CONCAT31(local_38._1_3_,(pAVar26->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14)
      ;
      WVar17 = AsmJsVarType::which((AsmJsVarType *)&local_38);
      pMVar27->type = WVar17;
      cVar2 = (pAVar26->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14;
      if (cVar2 == '\x03') {
        (pMVar27->initialiser).intInit = (Type)(pAVar26->mConstInitialiser).floatVal;
      }
      else if (cVar2 == '\x02') {
        pMVar27->initialiser = (Type)pAVar26->mConstInitialiser;
      }
      else if (cVar2 == '\0') {
        (pMVar27->initialiser).intInit = (Type)(pAVar26->mConstInitialiser).floatVal;
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar22 = 1;
        bVar16 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                     ,0xe1,"((0))","UNREACHED");
        if (!bVar16) goto LAB_00871156;
        *puVar22 = 0;
      }
      local_4c = local_4c + 1;
      iVar20 = (*(pAVar26->super_AsmJsVarBase).super_AsmJsSymbol._vptr_AsmJsSymbol[1])(pAVar26);
      pMVar27->isMutable = SUB41(iVar20,0);
      *(Type *)local_90 = pMVar27->location;
      local_38 = CONCAT31(local_38._1_3_,(pAVar26->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14)
      ;
      tVar18 = (type_info)AsmJsVarType::which((AsmJsVarType *)&local_38);
      *(type_info *)((long)local_90 + 8) = tVar18;
      *(byte *)((long)local_90 + 0x10) = pMVar27->isMutable ^ 1;
      this_05 = local_58;
      break;
    default:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar22 = 1;
      bVar16 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                   ,0x13c,"((0))","(0)");
      if (!bVar16) goto LAB_00871156;
      *puVar22 = 0;
      break;
    case MathConstant:
      pAVar34 = AsmJsMathConst::FromSymbol(pAVar23);
      *(double *)((long)local_90 + 8) = *pAVar34->mVal;
      break;
    case ConstantImport:
      pAVar32 = AsmJsConstantImport::FromSymbol(pAVar23);
      pMVar33 = AsmJsModuleInfo::GetVarImport(local_40,i_00);
      pMVar33->location = (pAVar32->super_AsmJsVarBase).mLocation;
      pMVar33->field = pAVar32->mField->m_propertyId;
      local_38 = CONCAT31(local_38._1_3_,(pAVar32->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14)
      ;
      tVar18 = (type_info)AsmJsVarType::which((AsmJsVarType *)&local_38);
      pMVar33->type = (Type)tVar18;
      *(Type *)local_90 = pMVar33->location;
      *(type_info *)((long)local_90 + 8) = tVar18;
      this_05 = local_58;
      uVar39 = local_34;
      i_00 = i_00 + 1;
      break;
    case ImportFunction:
      pAVar29 = AsmJsImportFunction::FromSymbol(pAVar23);
      pMVar30 = AsmJsModuleInfo::GetFunctionImport(local_40,i);
      TVar5 = (pAVar29->super_AsmJsFunctionDeclaration).mLocation;
      pMVar30->location = TVar5;
      pMVar30->field = pAVar29->mField->m_propertyId;
      *(Type *)local_90 = TVar5;
      uVar39 = local_34;
      i = i + 1;
      break;
    case FuncPtrTable:
      this_03 = AsmJsFunctionTable::FromSymbol(pAVar23);
      pAVar21 = local_40;
      TVar5 = (this_03->super_AsmJsFunctionDeclaration).mLocation;
      uVar39 = this_03->mSize;
      AsmJsModuleInfo::SetFunctionTableSize(local_40,TVar5,uVar39);
      local_64 = TVar5;
      pMVar31 = AsmJsModuleInfo::GetFunctionTable(pAVar21,TVar5);
      for (uVar40 = 0; uVar39 != uVar40; uVar40 = uVar40 + 1) {
        RVar19 = AsmJsFunctionTable::GetModuleFunctionIndex(this_03,(uint)uVar40);
        (pMVar31->moduleFunctionIndex).ptr[uVar40] = RVar19;
      }
      *(uint *)((long)local_90 + 8) = uVar39;
      *(Type *)local_90 = local_64;
      this_05 = local_58;
      uVar39 = local_34;
      break;
    case ModuleFunction:
      pAVar35 = AsmJsFunc::FromSymbol(pAVar23);
      iVar20 = exportIter.
               super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
               .usedEntryCount;
      pMVar36 = AsmJsModuleInfo::GetFunction(local_40,iVar20);
      TVar5 = (pAVar35->super_AsmJsFunctionDeclaration).mLocation;
      pMVar36->location = TVar5;
      *(Type *)local_90 = TVar5;
      exportIter.
      super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
      ._24_8_ = ZEXT48(iVar20 + 1);
      uVar39 = local_34;
      break;
    case ArrayView:
      pAVar28 = (AsmJsModuleArg *)AsmJsArrayView::FromSymbol(pAVar23);
      goto LAB_00871009;
    case MathBuiltinFunction:
      pAVar37 = AsmJsMathFunction::FromSymbol(pAVar23);
      goto LAB_0087102d;
    case TypedArrayBuiltinFunction:
      pAVar37 = (AsmJsMathFunction *)AsmJsTypedArrayFunction::FromSymbol(pAVar23);
LAB_0087102d:
      *(AsmJSMathBuiltinFunction *)((long)local_90 + 8) = pAVar37->mBuiltIn;
      break;
    case ModuleArgument:
      pAVar28 = AsmJsModuleArg::FromSymbol(pAVar23);
LAB_00871009:
      *(undefined1 *)((long)local_90 + 8) = (pAVar28->super_AsmJsSymbol).field_0x14;
      break;
    case ClosureFunction:
      break;
    }
switchD_00870e15_caseD_b:
    iVar38 = iVar38 + 1;
  } while( true );
}

Assistant:

bool AsmJsModuleCompiler::CommitModule()
    {
        FuncInfo* funcInfo = GetModuleFunctionNode()->funcInfo;
        FunctionBody* functionBody = funcInfo->GetParsedFunctionBody();
        AsmJsModuleInfo* asmInfo = functionBody->AllocateAsmJsModuleInfo();

        if (funcInfo->byteCodeFunction->GetIsNamedFunctionExpression())
        {
            Assert(GetModuleFunctionNode()->pnodeName);
            Assert(GetModuleFunctionNode()->pnodeName->nop == knopVarDecl);
            ParseNodeVar * nameNode = GetModuleFunctionNode()->pnodeName;
            if (nameNode->sym->IsInSlot(GetByteCodeGenerator(), funcInfo))
            {
                GetByteCodeGenerator()->AssignPropertyId(nameNode->name());
                // if module is a named function expression, we may need to restore this for debugger
                AsmJsClosureFunction* closure = Anew(&mAllocator, AsmJsClosureFunction, nameNode->pid, AsmJsSymbol::ClosureFunction, &mAllocator);
                DefineIdentifier(nameNode->pid, closure);
            }
        }

        int argCount = 0;
        if (mBufferArgName)
        {
            argCount = 3;
        }
        else if (mForeignArgName)
        {
            argCount = 2;
        }
        else if (mStdLibArgName)
        {
            argCount = 1;
        }

        const int functionCount = mFunctionArray.Count();
        const int functionTableCount = mFunctionTableArray.Count();
        const int importFunctionCount = mImportFunctions.GetTotalVarCount();
        asmInfo->SetFunctionCount(functionCount);
        asmInfo->SetFunctionTableCount(functionTableCount);
        asmInfo->SetFunctionImportCount(importFunctionCount);
        asmInfo->SetVarCount(mVarCount);
        asmInfo->SetVarImportCount(mVarImportCount);
        asmInfo->SetArgInCount(argCount);
        asmInfo->SetModuleMemory(mModuleMemory);
        asmInfo->SetAsmMathBuiltinUsed(mAsmMathBuiltinUsedBV);
        asmInfo->SetAsmArrayBuiltinUsed(mAsmArrayBuiltinUsedBV);
        asmInfo->SetMaxHeapAccess(mMaxHeapAccess);
        int varCount = 3; // 3 possible arguments

        functionBody->SetInParamsCount(4); // Always set 4 inParams so the memory space is the same (globalEnv,stdlib,foreign,buffer)
        functionBody->SetReportedInParamsCount(4);
        functionBody->CheckAndSetConstantCount(2); // Return register + Root
        functionBody->CreateConstantTable();
        functionBody->CheckAndSetVarCount(varCount);
        functionBody->SetIsAsmjsMode(true);
        functionBody->NewObjectLiteral(); // allocate one object literal for the export object

        AsmJSByteCodeGenerator::EmitEmptyByteCode(funcInfo, GetByteCodeGenerator(), GetModuleFunctionNode());

        // Create export module proxy
        asmInfo->SetExportFunctionIndex(mExportFuncIndex);
        asmInfo->SetExportsCount(mExports.Count());
        auto exportIter = mExports.GetIterator();

        for (int exportIndex = 0; exportIter.IsValid(); ++exportIndex)
        {
            const AsmJsModuleExport& exMod = exportIter.CurrentValue();
            auto ex = asmInfo->GetExport(exportIndex);
            *ex.id = exMod.id;
            *ex.location = exMod.location;
            exportIter.MoveNext();
        }

        int iVar = 0, iVarImp = 0, iFunc = 0, iFuncImp = 0;
        const int moduleEnvCount = mModuleEnvironment.Count();
        asmInfo->InitializeSlotMap(moduleEnvCount);
        auto slotMap = asmInfo->GetAsmJsSlotMap();
        for (int i = 0; i < moduleEnvCount; i++)
        {
            AsmJsSymbol* sym = mModuleEnvironment.GetValueAt(i);
            if (sym)
            {
                AsmJsSlot * slot = RecyclerNewLeaf(GetScriptContext()->GetRecycler(), AsmJsSlot);
                slot->symType = sym->GetSymbolType();
                slotMap->AddNew(sym->GetName()->GetPropertyId(), slot);
                switch (sym->GetSymbolType())
                {
                case AsmJsSymbol::Variable:
                {
                    AsmJsVar* var = AsmJsVar::FromSymbol(sym);
                    auto& modVar = asmInfo->GetVar(iVar++);
                    modVar.location = var->GetLocation();
                    modVar.type = var->GetVarType().which();
                    if (var->GetVarType().isInt())
                    {
                        modVar.initialiser.intInit = var->GetIntInitialiser();
                    }
                    else if (var->GetVarType().isFloat())
                    {
                        modVar.initialiser.floatInit = var->GetFloatInitialiser();
                    }
                    else if (var->GetVarType().isDouble())
                    {
                        modVar.initialiser.doubleInit = var->GetDoubleInitialiser();
                    }
                    else
                    {
                        Assert(UNREACHED);
                    }

                    modVar.isMutable = var->isMutable();

                    slot->location = modVar.location;
                    slot->varType = var->GetVarType().which();
                    slot->isConstVar = !modVar.isMutable;
                    break;
                }
                case AsmJsSymbol::ConstantImport:
                {
                    AsmJsConstantImport* var = AsmJsConstantImport::FromSymbol(sym);
                    auto& modVar = asmInfo->GetVarImport(iVarImp++);
                    modVar.location = var->GetLocation();
                    modVar.field = var->GetField()->GetPropertyId();
                    modVar.type = var->GetVarType().which();

                    slot->location = modVar.location;
                    slot->varType = modVar.type;
                    break;
                }
                case AsmJsSymbol::ImportFunction:
                {
                    AsmJsImportFunction* func = AsmJsImportFunction::FromSymbol(sym);
                    auto& modVar = asmInfo->GetFunctionImport(iFuncImp++);
                    modVar.location = func->GetFunctionIndex();
                    modVar.field = func->GetField()->GetPropertyId();

                    slot->location = modVar.location;
                    break;
                }
                case AsmJsSymbol::FuncPtrTable:
                {
                    AsmJsFunctionTable* funcTable = AsmJsFunctionTable::FromSymbol(sym);
                    const uint size = funcTable->GetSize();
                    const RegSlot index = funcTable->GetFunctionIndex();
                    asmInfo->SetFunctionTableSize(index, size);
                    auto& modTable = asmInfo->GetFunctionTable(index);
                    for (uint j = 0; j < size; j++)
                    {
                        modTable.moduleFunctionIndex[j] = funcTable->GetModuleFunctionIndex(j);
                    }
                    slot->funcTableSize = size;
                    slot->location = index;

                    break;
                }
                case AsmJsSymbol::ModuleFunction:
                {
                    AsmJsFunc* func = AsmJsFunc::FromSymbol(sym);
                    auto& modVar = asmInfo->GetFunction(iFunc++);
                    modVar.location = func->GetFunctionIndex();
                    slot->location = modVar.location;
                    break;
                }
                case AsmJsSymbol::ArrayView:
                {
                    AsmJsArrayView * var = AsmJsArrayView::FromSymbol(sym);
                    slot->viewType = var->GetViewType();
                    break;
                }
                case AsmJsSymbol::ModuleArgument:
                {
                    AsmJsModuleArg * arg = AsmJsModuleArg::FromSymbol(sym);
                    slot->argType = arg->GetArgType();
                    break;
                }
                // used only for module validation
                case AsmJsSymbol::MathConstant:
                {
                    AsmJsMathConst * constVar = AsmJsMathConst::FromSymbol(sym);
                    slot->mathConstVal = *constVar->GetVal();
                    break;
                }
                case AsmJsSymbol::MathBuiltinFunction:
                {
                    AsmJsMathFunction * mathFunc = AsmJsMathFunction::FromSymbol(sym);
                    slot->builtinMathFunc = mathFunc->GetMathBuiltInFunction();
                    break;
                }
                case AsmJsSymbol::TypedArrayBuiltinFunction:
                {
                    AsmJsTypedArrayFunction * mathFunc = AsmJsTypedArrayFunction::FromSymbol(sym);
                    slot->builtinArrayFunc = mathFunc->GetArrayBuiltInFunction();
                    break;
                }
                case AsmJsSymbol::ClosureFunction:
                    // we don't need to store any additional info in this case
                    break;
                default:
                    Assume(UNREACHED);
                }
            }
        }
        return true;
    }